

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O3

Gia_Man_t * Eso_ManCoverConvert(Eso_Man_t *p,Vec_Ptr_t *vCover)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  void *pvVar8;
  Hsh_VecMan_t *pHVar9;
  int iLit0;
  int iVar10;
  Gia_Man_t *p_00;
  size_t sVar11;
  char *pcVar12;
  Gia_Obj_t *pGVar13;
  Gia_Man_t *pGVar14;
  Vec_Int_t *pVVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  
  p_00 = Gia_ManStart(p->pGia->nObjs);
  pGVar14 = p->pGia;
  pcVar4 = pGVar14->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar4);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar4);
  }
  p_00->pName = pcVar12;
  pcVar4 = pGVar14->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar4);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar4);
  }
  p_00->pSpec = pcVar12;
  Gia_ManHashAlloc(p_00);
  pGVar14 = p->pGia;
  pGVar14->pObjs->Value = 0;
  pVVar15 = pGVar14->vCis;
  if (0 < pVVar15->nSize) {
    lVar17 = 0;
    do {
      iVar10 = pVVar15->pArray[lVar17];
      if (((long)iVar10 < 0) || (pGVar14->nObjs <= iVar10)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar5 = pGVar14->pObjs;
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pGVar13 = Gia_ManAppendObj(p_00);
      uVar6 = *(ulong *)pGVar13;
      *(ulong *)pGVar13 = uVar6 | 0x9fffffff;
      *(ulong *)pGVar13 =
           uVar6 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar7 = p_00->pObjs;
      if ((pGVar13 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar13)) {
LAB_007396b4:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar7) >> 2) * -0x55555555);
      pGVar7 = p_00->pObjs;
      if ((pGVar13 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar13)) goto LAB_007396b4;
      pGVar5[iVar10].Value = (int)((ulong)((long)pGVar13 - (long)pGVar7) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pGVar14 = p->pGia;
      pVVar15 = pGVar14->vCis;
    } while (lVar17 < pVVar15->nSize);
  }
  if (0 < vCover->nSize) {
    lVar17 = 0;
    do {
      pvVar8 = vCover->pArray[lVar17];
      iVar10 = 0;
      if (0 < *(int *)((long)pvVar8 + 4)) {
        lVar16 = 0;
        iVar10 = 0;
        do {
          uVar2 = *(uint *)(*(long *)((long)pvVar8 + 8) + lVar16 * 4);
          iLit0 = 1;
          if (uVar2 != p->Cube1) {
            if ((int)uVar2 < 0) {
              __assert_fail("iCube >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEsop.c"
                            ,0x30,"Vec_Int_t *Eso_ManCube(Eso_Man_t *, int)");
            }
            pHVar9 = p->pHash;
            if (pHVar9->vMap->nSize <= (int)uVar2) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar3 = pHVar9->vMap->pArray[uVar2];
            if (((long)iVar3 < 0) || (pHVar9->vData->nSize <= iVar3)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
            }
            piVar1 = pHVar9->vData->pArray + iVar3;
            iVar3 = *piVar1;
            (pHVar9->vTemp).nCap = iVar3;
            (pHVar9->vTemp).nSize = iVar3;
            (pHVar9->vTemp).pArray = piVar1 + 2;
            if (0 < iVar3) {
              lVar18 = 0;
              do {
                iLit0 = Gia_ManHashAnd(p_00,iLit0,(pHVar9->vTemp).pArray[lVar18] + 2);
                lVar18 = lVar18 + 1;
              } while (lVar18 < (pHVar9->vTemp).nSize);
            }
          }
          iVar10 = Gia_ManHashXor(p_00,iVar10,iLit0);
          lVar16 = lVar16 + 1;
        } while (lVar16 < *(int *)((long)pvVar8 + 4));
      }
      Gia_ManAppendCo(p_00,iVar10);
      lVar17 = lVar17 + 1;
    } while (lVar17 < vCover->nSize);
  }
  pGVar14 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar14;
}

Assistant:

Gia_Man_t * Eso_ManCoverConvert( Eso_Man_t * p, Vec_Ptr_t * vCover )
{
    Vec_Int_t * vEsop;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;  int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p->pGia)->Value = 0;
    Gia_ManForEachCi( p->pGia, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Vec_PtrForEachEntry( Vec_Int_t *, vCover, vEsop, i )
    {
        if ( Vec_IntSize(vEsop) > 0 )
        {
            int c, Cube, iRoot = 0;
            Vec_IntForEachEntry( vEsop, Cube, c )
            {
                int k, Lit, iAnd = 1;
                if ( Cube != p->Cube1 )
                {
                    Vec_Int_t * vCube = Eso_ManCube( p, Cube );
                    Vec_IntForEachEntry( vCube, Lit, k )
                        iAnd = Gia_ManHashAnd( pNew, iAnd, Lit + 2 );
                }
                iRoot = Gia_ManHashXor( pNew, iRoot, iAnd );
            }
            Gia_ManAppendCo( pNew, iRoot );
        }
        else
            Gia_ManAppendCo( pNew, 0 );
    }
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}